

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmList.cxx
# Opt level: O1

unique_ptr<cmList::TransformSelector,_std::default_delete<cmList::TransformSelector>_> __thiscall
cmList::TransformSelector::NewREGEX(TransformSelector *this,string *regex)

{
  char cVar1;
  _func_int **pp_Var2;
  runtime_error *this_00;
  string local_50;
  
  pp_Var2 = (_func_int **)operator_new(600);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50.field_2._M_allocated_capacity._0_4_ = 0x45474552;
  local_50.field_2._M_allocated_capacity._4_2_ = 0x58;
  local_50._M_string_length = 5;
  *pp_Var2 = (_func_int *)&PTR__TransformSelector_00b3bc00;
  pp_Var2[1] = (_func_int *)(pp_Var2 + 3);
  *(undefined4 *)(pp_Var2 + 3) = 0x45474552;
  *(undefined2 *)((long)pp_Var2 + 0x1c) = 0x58;
  *(undefined8 *)((long)pp_Var2 + 0x1e) = local_50.field_2._6_8_;
  *(undefined2 *)((long)pp_Var2 + 0x26) = local_50.field_2._14_2_;
  pp_Var2[2] = (_func_int *)0x5;
  *pp_Var2 = (_func_int *)&PTR__TransformSelectorRegex_00b3bd58;
  pp_Var2[0x47] = (_func_int *)0x0;
  pp_Var2[0x49] = (_func_int *)0x0;
  *(undefined4 *)(pp_Var2 + 0x4a) = 0;
  memset((RegularExpression *)(pp_Var2 + 5),0,0x20a);
  cmsys::RegularExpression::compile((RegularExpression *)(pp_Var2 + 5),(regex->_M_dataplus)._M_p);
  cVar1 = (**(code **)(*pp_Var2 + 0x18))(pp_Var2,0);
  if (cVar1 != '\0') {
    this->_vptr_TransformSelector = pp_Var2;
    return (__uniq_ptr_data<cmList::TransformSelector,_std::default_delete<cmList::TransformSelector>,_true,_true>
            )(__uniq_ptr_data<cmList::TransformSelector,_std::default_delete<cmList::TransformSelector>,_true,_true>
              )this;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  cmStrCat<char_const(&)[64],std::__cxx11::string_const&,char_const(&)[3]>
            (&local_50,
             (char (*) [64])"sub-command TRANSFORM, selector REGEX failed to compile regex \"",regex
             ,(char (*) [3])0x8ade9c);
  std::runtime_error::runtime_error(this_00,(string *)&local_50);
  *(undefined ***)this_00 = &PTR__runtime_error_00b3bdf0;
  __cxa_throw(this_00,&transform_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::unique_ptr<cmList::TransformSelector> cmList::TransformSelector::NewREGEX(
  std::string const& regex)
{
  std::unique_ptr<::TransformSelector> selector =
    cm::make_unique<TransformSelectorRegex>(regex);
  if (!selector->Validate()) {
    throw transform_error(
      cmStrCat("sub-command TRANSFORM, selector REGEX failed to compile "
               "regex \"",
               regex, "\"."));
  }
  // weird construct to please all compilers
  return std::unique_ptr<cmList::TransformSelector>(selector.release());
}